

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::python::Generator::
PrintSerializedPbInterval<google::protobuf::Descriptor,google::protobuf::DescriptorProto>
          (Generator *this,Descriptor *descriptor,DescriptorProto *proto)

{
  Printer *this_00;
  int32 i;
  LogMessage *other;
  char *pcVar1;
  string sp;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  char *local_c0;
  long local_b8;
  char local_b0 [32];
  LogMessage local_90;
  char *local_58;
  long local_50;
  char local_48 [32];
  
  Descriptor::CopyTo(descriptor,proto);
  local_120._M_string_length = 0;
  local_120.field_2._M_local_buf[0] = '\0';
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  MessageLite::SerializeToString((MessageLite *)proto,&local_120);
  i = std::__cxx11::string::find
                ((char *)&this->file_descriptor_serialized_,(ulong)local_120._M_dataplus._M_p,0);
  if (i < 0) {
    internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/python/python_generator.cc"
               ,0x4f8);
    other = internal::LogMessage::operator<<(&local_90,"CHECK failed: (offset) >= (0): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_c0,other);
    internal::LogMessage::~LogMessage(&local_90);
  }
  this_00 = this->printer_;
  local_c0 = local_b0;
  pcVar1 = FastInt32ToBufferLeft(i,local_b0);
  local_b8 = (long)pcVar1 - (long)local_b0;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,local_c0,local_c0 + local_b8);
  local_58 = local_48;
  pcVar1 = FastUInt64ToBufferLeft((long)i + local_120._M_string_length,local_48);
  local_50 = (long)pcVar1 - (long)local_48;
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,local_58,local_58 + local_50)
  ;
  io::Printer::Print<char[17],std::__cxx11::string,char[15],std::__cxx11::string>
            (this_00,"serialized_start=$serialized_start$,\nserialized_end=$serialized_end$,\n",
             (char (*) [17])"serialized_start",&local_e0,(char (*) [15])"serialized_end",&local_100)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Generator::PrintSerializedPbInterval(const DescriptorT& descriptor,
                                          DescriptorProtoT& proto) const {
  descriptor.CopyTo(&proto);
  std::string sp;
  proto.SerializeToString(&sp);
  int offset = file_descriptor_serialized_.find(sp);
  GOOGLE_CHECK_GE(offset, 0);

  printer_->Print(
      "serialized_start=$serialized_start$,\n"
      "serialized_end=$serialized_end$,\n",
      "serialized_start", StrCat(offset), "serialized_end",
      StrCat(offset + sp.size()));
}